

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlNodeSetLang(xmlNodePtr cur,xmlChar *lang)

{
  xmlAttrPtr pxVar1;
  int res;
  xmlAttrPtr attr;
  xmlNsPtr ns;
  xmlChar *lang_local;
  xmlNodePtr cur_local;
  
  if ((cur == (xmlNodePtr)0x0) || (cur->type != XML_ELEMENT_NODE)) {
    cur_local._4_4_ = 1;
  }
  else {
    ns = (xmlNsPtr)lang;
    lang_local = (xmlChar *)cur;
    cur_local._4_4_ =
         xmlSearchNsByHrefSafe
                   (cur,(xmlChar *)"http://www.w3.org/XML/1998/namespace",(xmlNsPtr *)&attr);
    if (cur_local._4_4_ == 0) {
      pxVar1 = xmlSetNsProp((xmlNodePtr)lang_local,(xmlNsPtr)attr,"lang",(xmlChar *)ns);
      if (pxVar1 == (xmlAttrPtr)0x0) {
        cur_local._4_4_ = -1;
      }
      else {
        cur_local._4_4_ = 0;
      }
    }
  }
  return cur_local._4_4_;
}

Assistant:

int
xmlNodeSetLang(xmlNodePtr cur, const xmlChar *lang) {
    xmlNsPtr ns;
    xmlAttrPtr attr;
    int res;

    if ((cur == NULL) || (cur->type != XML_ELEMENT_NODE))
        return(1);

    res = xmlSearchNsByHrefSafe(cur, XML_XML_NAMESPACE, &ns);
    if (res != 0)
        return(res);
    attr = xmlSetNsProp(cur, ns, BAD_CAST "lang", lang);
    if (attr == NULL)
        return(-1);

    return(0);
}